

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqrt.cc
# Opt level: O1

int BN_sqrt(BIGNUM *out_sqrt,BIGNUM *in,BN_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  BIGNUM *pBVar4;
  BIGNUM *dv;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  int line;
  uint uVar7;
  BIGNUM *local_50;
  
  if (in->neg == 0) {
    iVar2 = BN_is_zero(in);
    if (iVar2 == 0) {
      BN_CTX_start((BN_CTX *)ctx);
      pBVar4 = (BIGNUM *)out_sqrt;
      if (out_sqrt == in) {
        pBVar4 = BN_CTX_get((BN_CTX *)ctx);
      }
      dv = BN_CTX_get((BN_CTX *)ctx);
      pBVar5 = BN_CTX_get((BN_CTX *)ctx);
      local_50 = BN_CTX_get((BN_CTX *)ctx);
      uVar7 = 0;
      if ((local_50 != (BIGNUM *)0x0 && pBVar5 != (BIGNUM *)0x0) &&
          (dv != (BIGNUM *)0x0 && pBVar4 != (BIGNUM *)0x0)) {
        pBVar6 = BN_value_one();
        uVar3 = BN_num_bits((BIGNUM *)in);
        iVar2 = BN_lshift(pBVar4,pBVar6,uVar3 >> 1);
        if (iVar2 != 0) {
          iVar2 = BN_div(dv,(BIGNUM *)0x0,(BIGNUM *)in,pBVar4,(BN_CTX *)ctx);
          if (iVar2 != 0) {
            bVar1 = true;
            do {
              pBVar6 = pBVar5;
              iVar2 = BN_add(dv,dv,pBVar4);
              if (iVar2 == 0) break;
              iVar2 = BN_rshift1(pBVar4,dv);
              if (iVar2 == 0) break;
              iVar2 = BN_sqr(dv,pBVar4,(BN_CTX *)ctx);
              if (iVar2 == 0) break;
              iVar2 = BN_sub(local_50,(BIGNUM *)in,dv);
              if (iVar2 == 0) break;
              local_50->neg = 0;
              if (!bVar1) {
                iVar2 = BN_cmp(local_50,pBVar6);
                if (-1 < iVar2) {
                  iVar2 = BN_cmp(dv,(BIGNUM *)in);
                  if (iVar2 != 0) {
                    iVar2 = 0x6e;
                    line = 0x52;
                    goto LAB_0046c26d;
                  }
                  uVar7 = 1;
                  if (out_sqrt == in) {
                    pBVar4 = BN_copy((BIGNUM *)out_sqrt,pBVar4);
                    uVar7 = (uint)(pBVar4 != (BIGNUM *)0x0);
                  }
                  goto LAB_0046c272;
                }
              }
              bVar1 = false;
              iVar2 = BN_div(dv,(BIGNUM *)0x0,(BIGNUM *)in,pBVar4,(BN_CTX *)ctx);
              pBVar5 = local_50;
              local_50 = pBVar6;
            } while (iVar2 != 0);
          }
          iVar2 = 3;
          line = 0x3e;
LAB_0046c26d:
          uVar7 = 0;
          ERR_put_error(3,0,iVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/sqrt.cc"
                        ,line);
        }
      }
LAB_0046c272:
      BN_CTX_end((BN_CTX *)ctx);
    }
    else {
      BN_zero(out_sqrt);
      uVar7 = 1;
    }
  }
  else {
    uVar7 = 0;
    ERR_put_error(3,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/sqrt.cc"
                  ,0x19);
  }
  return uVar7;
}

Assistant:

int BN_sqrt(BIGNUM *out_sqrt, const BIGNUM *in, BN_CTX *ctx) {
  BIGNUM *estimate, *tmp, *delta, *last_delta, *tmp2;
  int ok = 0, last_delta_valid = 0;

  if (in->neg) {
    OPENSSL_PUT_ERROR(BN, BN_R_NEGATIVE_NUMBER);
    return 0;
  }
  if (BN_is_zero(in)) {
    BN_zero(out_sqrt);
    return 1;
  }

  bssl::BN_CTXScope scope(ctx);
  if (out_sqrt == in) {
    estimate = BN_CTX_get(ctx);
  } else {
    estimate = out_sqrt;
  }
  tmp = BN_CTX_get(ctx);
  last_delta = BN_CTX_get(ctx);
  delta = BN_CTX_get(ctx);
  if (estimate == NULL || tmp == NULL || last_delta == NULL || delta == NULL) {
    goto err;
  }

  // We estimate that the square root of an n-bit number is 2^{n/2}.
  if (!BN_lshift(estimate, BN_value_one(), BN_num_bits(in)/2)) {
    goto err;
  }

  // This is Newton's method for finding a root of the equation |estimate|^2 -
  // |in| = 0.
  for (;;) {
    // |estimate| = 1/2 * (|estimate| + |in|/|estimate|)
    if (!BN_div(tmp, NULL, in, estimate, ctx) ||
        !BN_add(tmp, tmp, estimate) ||
        !BN_rshift1(estimate, tmp) ||
        // |tmp| = |estimate|^2
        !BN_sqr(tmp, estimate, ctx) ||
        // |delta| = |in| - |tmp|
        !BN_sub(delta, in, tmp)) {
      OPENSSL_PUT_ERROR(BN, ERR_R_BN_LIB);
      goto err;
    }

    delta->neg = 0;
    // The difference between |in| and |estimate| squared is required to always
    // decrease. This ensures that the loop always terminates, but I don't have
    // a proof that it always finds the square root for a given square.
    if (last_delta_valid && BN_cmp(delta, last_delta) >= 0) {
      break;
    }

    last_delta_valid = 1;

    tmp2 = last_delta;
    last_delta = delta;
    delta = tmp2;
  }

  if (BN_cmp(tmp, in) != 0) {
    OPENSSL_PUT_ERROR(BN, BN_R_NOT_A_SQUARE);
    goto err;
  }

  ok = 1;

err:
  if (ok && out_sqrt == in && !BN_copy(out_sqrt, estimate)) {
    ok = 0;
  }
  return ok;
}